

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_TranslateCnf(Vec_Int_t *vClas,Vec_Int_t *vLits,Vec_Str_t *vCnf,Vec_Int_t *vSatVars,
                     int iPivotVar)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Vec_Int_t *p;
  
  if (0 < vCnf->nSize) {
    lVar3 = 0;
    do {
      uVar2 = (uint)vCnf->pArray[lVar3];
      if (uVar2 == 0xffffffff) {
        uVar2 = vLits->nSize;
        p = vClas;
      }
      else {
        if (vCnf->pArray[lVar3] < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        iVar1 = vSatVars->pArray[uVar2 >> 1];
        if (iVar1 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar2 = (uint)(iVar1 == iPivotVar) ^ (uVar2 & 1) + iVar1 * 2;
        p = vLits;
      }
      Vec_IntPush(p,uVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCnf->nSize);
  }
  return;
}

Assistant:

void Acb_TranslateCnf( Vec_Int_t * vClas, Vec_Int_t * vLits, Vec_Str_t * vCnf, Vec_Int_t * vSatVars, int iPivotVar )
{
    signed char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vSatVars), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vLits, Lit );
    }
}